

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_Solver.cpp
# Opt level: O0

void __thiscall BGCG_Solver::BGCG_Solver(BGCG_Solver *this,BGCG_constPtr *bg,size_t nrSolutions)

{
  size_t in_RSI;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *in_RDI;
  BayesianGameIdenticalPayoffSolver *unaff_retaddr;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *in_stack_ffffffffffffffa8;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_28;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *bg_00;
  
  bg_00 = in_RDI;
  boost::shared_ptr<BayesianGameIdenticalPayoffInterface_const>::
  shared_ptr<BayesianGameCollaborativeGraphical_const>(&local_28,in_RSI);
  BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
            (unaff_retaddr,(shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)bg_00,in_RSI);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x888351);
  in_RDI->px = (element_type *)&PTR_InitDeadline_00d03c18;
  boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::shared_ptr
            (in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

BGCG_Solver::BGCG_Solver(const BGCG_constPtr &bg, size_t nrSolutions):
    BayesianGameIdenticalPayoffSolver(bg, nrSolutions),
    _m_bgcg(bg)
{
}